

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

int parse_num(Context_conflict2 *ctx,int floatok,uint32 *value)

{
  float fVar1;
  Token TVar2;
  Token TVar3;
  float fVar4;
  float extraout_EAX;
  char *pcVar5;
  anon_union_4_3_ec4f19c4 cvt;
  int d;
  float local_30;
  float local_2c;
  
  TVar2 = nexttoken(ctx);
  TVar3 = TVar2;
  if (TVar2 == 0x2d) {
    TVar3 = nexttoken(ctx);
  }
  if (TVar3 == TOKEN_FLOAT_LITERAL) {
    if (floatok != 0) {
      fVar4 = (float)__isoc99_sscanf(ctx->token,"%f",&local_30);
      if (TVar2 == 0x2d) {
        local_30 = -local_30;
      }
      goto LAB_00151c72;
    }
    pcVar5 = "Expected whole number";
  }
  else {
    if (TVar3 == TOKEN_INT_LITERAL) {
      local_2c = 0.0;
      __isoc99_sscanf(ctx->token,"%d",&local_2c);
      fVar1 = (float)-(int)local_2c;
      if (TVar2 != 0x2d) {
        fVar1 = local_2c;
      }
      local_30 = (float)(int)fVar1;
      fVar4 = (float)(int)fVar1;
      if (floatok == 0) {
        local_30 = fVar1;
        fVar4 = fVar1;
      }
      goto LAB_00151c72;
    }
    pcVar5 = "Expected number";
  }
  failf(ctx,"%s",pcVar5);
  local_30 = 0.0;
  fVar4 = extraout_EAX;
LAB_00151c72:
  *value = (uint32)local_30;
  return (int)fVar4;
}

Assistant:

static int parse_num(Context *ctx, const int floatok, uint32 *value)
{
    union { float f; int32 si32; uint32 ui32; } cvt;
    int negative = 0;
    Token token = nexttoken(ctx);

    if (token == ((Token) '-'))
    {
        negative = 1;
        token = nexttoken(ctx);
    } // if

    if (token == TOKEN_INT_LITERAL)
    {
        int d = 0;
        sscanf(ctx->token, "%d", &d);
        if (floatok)
            cvt.f = (float) ((negative) ? -d : d);
        else
            cvt.si32 = (int32) ((negative) ? -d : d);
    } // if
    else if (token == TOKEN_FLOAT_LITERAL)
    {
        if (!floatok)
        {
            fail(ctx, "Expected whole number");
            *value = 0;
            return 0;
        } // if
        sscanf(ctx->token, "%f", &cvt.f);
        if (negative)
            cvt.f = -cvt.f;
    } // if
    else
    {
        fail(ctx, "Expected number");
        *value = 0;
        return 0;
    } // else

    *value = cvt.ui32;
    return 1;
}